

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> __thiscall
booster::locale::impl_posix::num_format<wchar_t>::write_it
          (num_format<wchar_t> *this,ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> out,
          char *ptr,size_t n)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  char *pcVar3;
  uint uVar4;
  streambuf_type *psVar5;
  ulong uVar6;
  ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> oVar7;
  wstring tmp;
  allocator local_69;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_68;
  string local_48;
  
  psVar5 = out._M_sbuf;
  uVar4 = out._8_4_;
  pcVar3 = nl_langinfo_l(0xe,(__locale_t)
                             *(this->lc_).
                              super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
  std::__cxx11::string::string((string *)&local_48,pcVar3,&local_69);
  conv::to_utf<wchar_t>(&local_68,ptr,ptr + n,&local_48,default_method);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_68._M_string_length != 0) {
    uVar6 = 0;
    do {
      if ((uVar4 & 1) == 0) {
        wVar2 = local_68._M_dataplus._M_p[uVar6];
        pwVar1 = *(wchar_t **)(psVar5 + 0x28);
        if (pwVar1 < *(wchar_t **)(psVar5 + 0x30)) {
          *pwVar1 = wVar2;
          *(wchar_t **)(psVar5 + 0x28) = pwVar1 + 1;
        }
        else {
          wVar2 = (**(code **)(*(long *)psVar5 + 0x68))(psVar5,wVar2);
        }
        uVar4 = uVar4 & 0xff;
        if (wVar2 == L'\xffffffff') {
          uVar4 = 1;
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < local_68._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  oVar7._8_4_ = uVar4;
  oVar7._M_sbuf = psVar5;
  oVar7._12_4_ = 0;
  return oVar7;
}

Assistant:

std::ostreambuf_iterator<wchar_t> write_it(std::ostreambuf_iterator<wchar_t> out,char const *ptr,size_t n) const
    {
        std::wstring tmp = conv::to_utf<wchar_t>(ptr,ptr+n,nl_langinfo_l(CODESET,*lc_));
        for(size_t i=0;i<tmp.size();i++)
            *out++ = tmp[i];
        return out;
    }